

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo-main.cpp
# Opt level: O3

int main(void)

{
  long *plVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  char local_89;
  char *local_88;
  long local_80;
  char local_78 [16];
  char *local_68;
  long local_60;
  char local_58 [16];
  undefined8 *local_48;
  undefined8 *local_40;
  
  linktimeplugin::RegistrarBase<Animal>::plugins();
  if (local_48 != local_40) {
    puVar3 = local_48;
    do {
      plVar1 = (long *)*puVar3;
      (**(code **)*plVar1)(&local_68,plVar1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_68,local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      (**(code **)(*plVar1 + 8))(&local_88,plVar1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_88,local_80);
      local_89 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_89,1);
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != local_40);
  }
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48);
  }
  return 0;
}

Assistant:

int main() {
    for (const auto animal : linktimeplugin::plugins<Animal>()) {
        std::cout << animal->name() << ": " << animal->sound() << '\n';
    }

    return EXIT_SUCCESS;
}